

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void print_sig(FuncType *sig)

{
  bool bVar1;
  FILE *pFVar2;
  bool bVar3;
  reference pTVar4;
  char *pcVar5;
  Type local_54;
  const_iterator cStack_50;
  Type Type_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  ValueTypes *__range1_1;
  const_iterator cStack_30;
  Type Type;
  const_iterator __end1;
  const_iterator __begin1;
  ValueTypes *__range1;
  bool first;
  FuncType *sig_local;
  
  fprintf(_stderr,"(");
  bVar1 = true;
  __end1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(&sig->params);
  cStack_30 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(&sig->params);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar3) break;
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
             ::operator*(&__end1);
    __range1_1._4_4_ = pTVar4->enum_;
    if (!bVar1) {
      fprintf(_stderr,", ");
    }
    pFVar2 = _stderr;
    bVar1 = false;
    pcVar5 = wabt::Type::GetName((Type *)((long)&__range1_1 + 4));
    fprintf(pFVar2,"%s",pcVar5);
    __gnu_cxx::
    __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
    operator++(&__end1);
  }
  fprintf(_stderr,") -> (");
  bVar1 = true;
  __end1_1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(&sig->results);
  cStack_50 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(&sig->results);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffffb0);
    if (!bVar3) break;
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
             ::operator*(&__end1_1);
    local_54.enum_ = pTVar4->enum_;
    if (!bVar1) {
      fprintf(_stderr,", ");
    }
    pFVar2 = _stderr;
    bVar1 = false;
    pcVar5 = wabt::Type::GetName(&local_54);
    fprintf(pFVar2,"%s",pcVar5);
    __gnu_cxx::
    __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
    operator++(&__end1_1);
  }
  fprintf(_stderr,")\n");
  return;
}

Assistant:

static void print_sig(const FuncType& sig) {
#ifndef NDEBUG
  fprintf(stderr, "(");
  bool first = true;
  for (auto Type : sig.params) {
    if (!first) {
      fprintf(stderr, ", ");
    }
    first = false;
    fprintf(stderr, "%s", Type.GetName());
  }
  fprintf(stderr, ") -> (");
  first = true;
  for (auto Type : sig.results) {
    if (!first) {
      fprintf(stderr, ", ");
    }
    first = false;
    fprintf(stderr, "%s", Type.GetName());
  }
  fprintf(stderr, ")\n");
#endif
}